

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_service_interface_factory
          (t_cpp_generator *this,t_service *tservice,string *style)

{
  char cVar1;
  t_service *ptVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  string singleton_factory_name;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118 [8];
  string extends;
  string factory_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string base_if_name;
  t_service *base_service;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string service_if_name;
  string *style_local;
  t_service *tservice_local;
  t_cpp_generator *this_local;
  
  service_if_name.field_2._8_8_ = style;
  std::operator+(&local_60,&(this->super_t_oop_generator).super_t_generator.service_name_,style);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,"If");
  std::__cxx11::string::~string((string *)&local_60);
  base_if_name.field_2._8_8_ = tservice;
  while( true ) {
    ptVar2 = t_service::get_extends((t_service *)base_if_name.field_2._8_8_);
    if (ptVar2 == (t_service *)0x0) break;
    base_if_name.field_2._8_8_ = (size_type)t_service::get_extends(base_if_name.field_2._8_8_);
  }
  type_name_abi_cxx11_
            ((string *)((long)&factory_name.field_2 + 8),this,(t_type *)base_if_name.field_2._8_8_,
             false,false);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&factory_name.field_2 + 8),style);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_b8,"If");
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(factory_name.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&extends.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "Factory");
  std::__cxx11::string::string(local_118);
  ptVar2 = t_service::get_extends(tservice);
  if (ptVar2 != (t_service *)0x0) {
    ptVar2 = t_service::get_extends(tservice);
    type_name_abi_cxx11_(&local_198,this,&ptVar2->super_t_type,false,false);
    std::operator+(&local_178," : virtual public ",&local_198);
    std::operator+(&local_158,&local_178,style);
    std::operator+(&local_138,&local_158,"IfFactory");
    std::__cxx11::string::operator=(local_118,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
  }
  poVar3 = std::operator<<((ostream *)&this->f_header_,"class ");
  poVar3 = std::operator<<(poVar3,(string *)(extends.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,local_118);
  poVar3 = std::operator<<(poVar3," {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," public:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,(string *)&local_1b8);
  poVar3 = std::operator<<(poVar3,"typedef ");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3," Handler;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  poVar3 = std::operator<<(poVar3,"virtual ~");
  poVar3 = std::operator<<(poVar3,(string *)(extends.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3,"() {}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_1f8);
  poVar3 = std::operator<<(poVar3,"virtual ");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"* getHandler(");
  poVar3 = std::operator<<(poVar3,"const ::apache::thrift::TConnectionInfo& connInfo)");
  cVar1 = std::__cxx11::string::empty();
  pcVar4 = " override";
  if (cVar1 != '\0') {
    pcVar4 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3," = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_218,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  poVar3 = std::operator<<(poVar3,"virtual void releaseHandler(");
  poVar3 = std::operator<<(poVar3,(string *)local_98);
  poVar3 = std::operator<<(poVar3,"* /* handler */)");
  cVar1 = std::__cxx11::string::empty();
  pcVar4 = " override";
  if (cVar1 != '\0') {
    pcVar4 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3," = 0;");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)((long)&singleton_factory_name.field_2 + 8),(t_generator *)this);
  std::operator<<(poVar3,(string *)(singleton_factory_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(singleton_factory_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,"};");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "SingletonFactory");
  poVar3 = std::operator<<((ostream *)&this->f_header_,"class ");
  poVar3 = std::operator<<(poVar3,(string *)local_258);
  poVar3 = std::operator<<(poVar3," : virtual public ");
  poVar3 = std::operator<<(poVar3,(string *)(extends.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," public:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_278,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,(string *)&local_278);
  poVar3 = std::operator<<(poVar3,(string *)local_258);
  poVar3 = std::operator<<(poVar3,"(const ::std::shared_ptr<");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,">& iface) : iface_(iface) {}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_298);
  poVar3 = std::operator<<(poVar3,"virtual ~");
  poVar3 = std::operator<<(poVar3,(string *)local_258);
  poVar3 = std::operator<<(poVar3,"() {}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
  poVar3 = std::operator<<(poVar3,"virtual ");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"* getHandler(");
  poVar3 = std::operator<<(poVar3,"const ::apache::thrift::TConnectionInfo&) override {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2d8);
  poVar3 = std::operator<<(poVar3,"  return iface_.get();");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_2f8,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_2f8);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_318,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_318);
  poVar3 = std::operator<<(poVar3,"virtual void releaseHandler(");
  poVar3 = std::operator<<(poVar3,(string *)local_98);
  poVar3 = std::operator<<(poVar3,"* /* handler */) override {}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
  poVar3 = std::operator<<((ostream *)&this->f_header_,(string *)&::endl_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," protected:");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_338,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_338);
  poVar3 = std::operator<<(poVar3,"::std::shared_ptr<");
  poVar3 = std::operator<<(poVar3,(string *)local_40);
  poVar3 = std::operator<<(poVar3,"> iface_;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_338);
  t_generator::indent_down((t_generator *)this);
  poVar3 = std::operator<<((ostream *)&this->f_header_,"};");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_258);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string((string *)(extends.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_cpp_generator::generate_service_interface_factory(t_service* tservice, string style) {
  string service_if_name = service_name_ + style + "If";

  // Figure out the name of the upper-most parent class.
  // Getting everything to work out properly with inheritance is annoying.
  // Here's what we're doing for now:
  //
  // - All handlers implement getHandler(), but subclasses use covariant return
  //   types to return their specific service interface class type.  We have to
  //   use raw pointers because of this; shared_ptr<> can't be used for
  //   covariant return types.
  //
  // - Since we're not using shared_ptr<>, we also provide a releaseHandler()
  //   function that must be called to release a pointer to a handler obtained
  //   via getHandler().
  //
  //   releaseHandler() always accepts a pointer to the upper-most parent class
  //   type.  This is necessary since the parent versions of releaseHandler()
  //   may accept any of the parent types, not just the most specific subclass
  //   type.  Implementations can use dynamic_cast to cast the pointer to the
  //   subclass type if desired.
  t_service* base_service = tservice;
  while (base_service->get_extends() != nullptr) {
    base_service = base_service->get_extends();
  }
  string base_if_name = type_name(base_service) + style + "If";

  // Generate the abstract factory class
  string factory_name = service_if_name + "Factory";
  string extends;
  if (tservice->get_extends() != nullptr) {
    extends = " : virtual public " + type_name(tservice->get_extends()) + style + "IfFactory";
  }

  f_header_ << "class " << factory_name << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "typedef " << service_if_name << " Handler;" << endl << endl << indent()
            << "virtual ~" << factory_name << "() {}" << endl << endl << indent() << "virtual "
            << service_if_name << "* getHandler("
            << "const ::apache::thrift::TConnectionInfo& connInfo)"
            << (extends.empty() ? "" : " override") << " = 0;" << endl << indent()
            << "virtual void releaseHandler(" << base_if_name << "* /* handler */)"
            << (extends.empty() ? "" : " override") << " = 0;" << endl << indent();

  indent_down();
  f_header_ << "};" << endl << endl;

  // Generate the singleton factory class
  string singleton_factory_name = service_if_name + "SingletonFactory";
  f_header_ << "class " << singleton_factory_name << " : virtual public " << factory_name << " {"
            << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << singleton_factory_name << "(const ::std::shared_ptr<" << service_if_name
            << ">& iface) : iface_(iface) {}" << endl << indent() << "virtual ~"
            << singleton_factory_name << "() {}" << endl << endl << indent() << "virtual "
            << service_if_name << "* getHandler("
            << "const ::apache::thrift::TConnectionInfo&) override {" << endl << indent()
            << "  return iface_.get();" << endl << indent() << "}" << endl << indent()
            << "virtual void releaseHandler(" << base_if_name << "* /* handler */) override {}" << endl;

  f_header_ << endl << " protected:" << endl << indent() << "::std::shared_ptr<" << service_if_name
            << "> iface_;" << endl;

  indent_down();
  f_header_ << "};" << endl << endl;
}